

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.h
# Opt level: O1

void __thiscall MT32Emu::AbstractFile::~AbstractFile(AbstractFile *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

class MT32EMU_EXPORT AbstractFile : public File {
public:
	const SHA1Digest &getSHA1();

protected:
	AbstractFile();
	AbstractFile(const SHA1Digest &sha1Digest);

private:
	bool sha1DigestCalculated;
	SHA1Digest sha1Digest;

	// Binary compatibility helper.
	void *reserved;
}